

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O0

bool EV_TeleportGroup(int group_tid,AActor *victim,int source_tid,int dest_tid,bool moveSource,
                     bool fog)

{
  bool bVar1;
  AActor *source;
  AActor *dest;
  PClass *base;
  AActor *victim_00;
  double local_d0;
  TAngle<double> local_98;
  DVector3 local_90;
  undefined1 local_78 [8];
  FActorIterator iterator_2;
  undefined1 local_60 [2];
  bool floorz;
  bool didSomething;
  NActorIterator iterator_1;
  FActorIterator iterator;
  AActor *destOrigin;
  AActor *sourceOrigin;
  bool fog_local;
  bool moveSource_local;
  int dest_tid_local;
  int source_tid_local;
  AActor *victim_local;
  int group_tid_local;
  
  FActorIterator::FActorIterator((FActorIterator *)&iterator_1.type,source_tid);
  source = FActorIterator::Next((FActorIterator *)&iterator_1.type);
  if (source == (AActor *)0x0) {
    victim_local._7_1_ = EV_TeleportOther(group_tid,dest_tid,fog);
  }
  else {
    FName::FName((FName *)&iterator_2.field_0xc,NAME_TeleportDest);
    NActorIterator::NActorIterator
              ((NActorIterator *)local_60,(FName *)&iterator_2.field_0xc,dest_tid);
    dest = NActorIterator::Next((NActorIterator *)local_60);
    if (dest == (AActor *)0x0) {
      victim_local._7_1_ = false;
    }
    else {
      iterator_2.id._3_1_ = 0;
      base = PClass::FindClass("TeleportDest2");
      bVar1 = DObject::IsKindOf((DObject *)dest,base);
      iterator_2.id._2_1_ = (bVar1 ^ 0xffU) & 1;
      if ((group_tid == 0) && (victim != (AActor *)0x0)) {
        iterator_2.id._3_1_ = DoGroupForOne(victim,source,dest,(bool)iterator_2.id._2_1_,fog);
      }
      else {
        FActorIterator::FActorIterator((FActorIterator *)local_78,group_tid);
        while (victim_00 = FActorIterator::Next((FActorIterator *)local_78),
              victim_00 != (AActor *)0x0) {
          bVar1 = DoGroupForOne(victim_00,source,dest,(bool)(iterator_2.id._2_1_ & 1),fog);
          iterator_2.id._3_1_ = (iterator_2.id._3_1_ & 1) != 0 || bVar1;
        }
      }
      if ((moveSource) && ((iterator_2.id._3_1_ & 1) != 0)) {
        if ((iterator_2.id._2_1_ & 1) == 0) {
          local_d0 = AActor::Z(dest);
        }
        else {
          local_d0 = -2147483648.0;
        }
        AActor::PosAtZ(&local_90,dest,local_d0);
        TAngle<double>::TAngle(&local_98,0.0);
        bVar1 = P_Teleport(source,&local_90,&local_98,4);
        iterator_2.id._3_1_ = (iterator_2.id._3_1_ & 1) != 0 || bVar1;
        TAngle<double>::operator=(&(source->Angles).Yaw,&(dest->Angles).Yaw);
      }
      victim_local._7_1_ = (bool)(iterator_2.id._3_1_ & 1);
    }
  }
  return victim_local._7_1_;
}

Assistant:

bool EV_TeleportGroup (int group_tid, AActor *victim, int source_tid, int dest_tid, bool moveSource, bool fog)
{
	AActor *sourceOrigin, *destOrigin;
	{
		FActorIterator iterator (source_tid);
		sourceOrigin = iterator.Next ();
	}
	if (sourceOrigin == NULL)
	{ // If there is no source origin, behave like TeleportOther
		return EV_TeleportOther (group_tid, dest_tid, fog);
	}

	{
		NActorIterator iterator (NAME_TeleportDest, dest_tid);
		destOrigin = iterator.Next ();
	}
	if (destOrigin == NULL)
	{
		return false;
	}

	bool didSomething = false;
	bool floorz = !destOrigin->IsKindOf (PClass::FindClass("TeleportDest2"));

	// Use the passed victim if group_tid is 0
	if (group_tid == 0 && victim != NULL)
	{
		didSomething = DoGroupForOne (victim, sourceOrigin, destOrigin, floorz, fog);
	}
	else
	{
		FActorIterator iterator (group_tid);

		// For each actor with tid matching arg0, move it to the same
		// position relative to destOrigin as it is relative to sourceOrigin
		// before the teleport.
		while ( (victim = iterator.Next ()) )
		{
			didSomething |= DoGroupForOne (victim, sourceOrigin, destOrigin, floorz, fog);
		}
	}

	if (moveSource && didSomething)
	{
		didSomething |=
			P_Teleport (sourceOrigin, destOrigin->PosAtZ(floorz ? ONFLOORZ : destOrigin->Z()), 0., TELF_KEEPORIENTATION);
		sourceOrigin->Angles.Yaw = destOrigin->Angles.Yaw;
	}

	return didSomething;
}